

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr.hpp
# Opt level: O2

void __thiscall
boost::shared_ptr<JointPolicyDiscretePure>::reset(shared_ptr<JointPolicyDiscretePure> *this)

{
  shared_count asStack_10 [2];
  
  asStack_10[0].pi_ = (this->pn).pi_;
  this->px = (element_type *)0x0;
  (this->pn).pi_ = (sp_counted_base *)0x0;
  detail::shared_count::~shared_count(asStack_10);
  return;
}

Assistant:

void reset() BOOST_NOEXCEPT // never throws in 1.30+
    {
        this_type().swap(*this);
    }